

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  bool bVar2;
  cmConditionEvaluator *this_00;
  iterator arg;
  int reducible;
  iterator argP2;
  iterator argP1;
  iterator local_50;
  int local_44;
  iterator local_40;
  iterator local_38;
  
  do {
    local_44 = 0;
    local_50._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_40._M_node = (_List_node_base *)0x0;
    for (; local_50._M_node != (_List_node_base *)newArgs;
        local_50._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_50._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_38._M_node = local_50._M_node;
      if (local_50._M_node != (_List_node_base *)newArgs) {
        local_38._M_node = (local_50._M_node)->_M_next;
        local_40._M_node = local_38._M_node;
        if (local_38._M_node != (_List_node_base *)newArgs) {
          local_40._M_node = (local_38._M_node)->_M_next;
        }
      }
      iVar1._M_node = local_38._M_node;
      if (local_38._M_node != (_List_node_base *)newArgs) {
        bVar2 = IsKeyword(this,&keyNOT_abi_cxx11_,
                          (cmExpandedCommandArgument *)(local_50._M_node + 1));
        if (bVar2) {
          this_00 = this;
          bVar2 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(iVar1._M_node + 1),errorString,
                             status,false);
          HandlePredicate(this_00,!bVar2,&local_44,&local_50,newArgs,&local_38,&local_40);
        }
      }
    }
  } while (local_44 != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && IsKeyword(keyNOT, *arg)) {
        bool rhs = this->GetBooleanValueWithAutoDereference(
          *argP1, errorString, status);
        this->HandlePredicate(!rhs, reducible, arg, newArgs, argP1, argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}